

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blns.cpp
# Opt level: O2

void blns::Blns::readFile(void)

{
  uint __line;
  char cVar1;
  istream *piVar2;
  long lVar3;
  char *__assertion;
  string line;
  path local_340;
  path local_318;
  path local_2f0;
  path local_2c8;
  path local_2a0;
  path local_278;
  path local_250;
  ifstream blnsFile;
  
  std::filesystem::__cxx11::path::path<char[88],std::filesystem::__cxx11::path>
            (&local_250,
             (char (*) [88])
             "/workspace/llm4binary/github/license_c_cmakelists/eliabieri[P]blnscpp/src/blns/blns.cpp"
             ,auto_format);
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::path::path<char[3],std::filesystem::__cxx11::path>
            (&local_2f0,(char (*) [3])"..",auto_format);
  std::filesystem::__cxx11::operator/(&local_2a0,&local_2c8,&local_2f0);
  std::filesystem::__cxx11::path::path<char[3],std::filesystem::__cxx11::path>
            (&local_318,(char (*) [3])"..",auto_format);
  std::filesystem::__cxx11::operator/(&local_278,&local_2a0,&local_318);
  std::filesystem::__cxx11::path::path<char[9],std::filesystem::__cxx11::path>
            (&local_340,(char (*) [9])"blns.txt",auto_format);
  std::filesystem::__cxx11::operator/((path *)&line,&local_278,&local_340);
  std::ifstream::ifstream(&blnsFile,line._M_dataplus._M_p,_S_in);
  std::filesystem::__cxx11::path::~path((path *)&line);
  std::filesystem::__cxx11::path::~path(&local_340);
  std::filesystem::__cxx11::path::~path(&local_278);
  std::filesystem::__cxx11::path::~path(&local_318);
  std::filesystem::__cxx11::path::~path(&local_2a0);
  std::filesystem::__cxx11::path::~path(&local_2f0);
  std::filesystem::__cxx11::path::~path(&local_2c8);
  std::filesystem::__cxx11::path::~path(&local_250);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    __assertion = "blnsFile.is_open()";
    __line = 0x15;
  }
  else {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&blnsFile,(string *)&line);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      if (line._M_string_length != 0) {
        lVar3 = std::__cxx11::string::rfind((char)&line,0x23);
        if (lVar3 != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&s_blns_abi_cxx11_,&line);
        }
      }
    }
    if (s_blns_abi_cxx11_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        s_blns_abi_cxx11_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::~string((string *)&line);
      std::ifstream::~ifstream(&blnsFile);
      return;
    }
    __assertion = "!s_blns.empty()";
    __line = 0x1e;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/eliabieri[P]blnscpp/src/blns/blns.cpp"
                ,__line,"static void blns::Blns::readFile()");
}

Assistant:

void blns::Blns::readFile() {
    std::ifstream blnsFile = std::filesystem::path(__FILE__).parent_path()
                             / ".." / ".." / "blns.txt";

    // If this assertion fails, ensure that you have correctly
    // downloaded blns.txt at the root of the project during cmake build
    assert(blnsFile.is_open());

    std::string line;
    while(getline(blnsFile, line)) {
        // Skip comments in txt file
        if(!line.empty() && line.rfind('#', 0) != 0) {
            s_blns.push_back(line);
        }
    }
    assert(!s_blns.empty());
}